

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_channel_id_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((hs->config->channel_id_private)._M_t.
      super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl != (evp_pkey_st *)0x0) {
    iVar1 = SSL_is_dtls(hs->ssl);
    if ((type != ssl_client_hello_outer) && (iVar1 == 0)) {
      iVar1 = CBB_add_u16(out,0x7550);
      if (iVar1 == 0) {
        bVar2 = false;
      }
      else {
        iVar1 = CBB_add_u16(out,0);
        bVar2 = iVar1 != 0;
      }
    }
  }
  return bVar2;
}

Assistant:

static bool ext_channel_id_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                           CBB *out_compressible,
                                           ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  if (!hs->config->channel_id_private || SSL_is_dtls(ssl) ||
      // Don't offer Channel ID in ClientHelloOuter. ClientHelloOuter handshakes
      // are not authenticated for the name that can learn the Channel ID.
      //
      // We could alternatively offer the extension but sign with a random key.
      // For other extensions, we try to align |ssl_client_hello_outer| and
      // |ssl_client_hello_unencrypted|, to improve the effectiveness of ECH
      // GREASE. However, Channel ID is deprecated and unlikely to be used with
      // ECH, so do the simplest thing.
      type == ssl_client_hello_outer) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_channel_id) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}